

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BoundingSphereRecord.cpp
# Opt level: O2

void __thiscall
KDIS::DATA_TYPE::BoundingSphereRecord::BoundingSphereRecord
          (BoundingSphereRecord *this,KUINT8 Index,WorldCoordinates *CentroidLocation,
          KFLOAT32 Radius)

{
  KFLOAT64 KVar1;
  
  EnvironmentRecord::EnvironmentRecord(&this->super_EnvironmentRecord);
  (this->super_EnvironmentRecord).super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__BoundingSphereRecord_00226810;
  (this->m_CentLocation).super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__DataTypeBase_002181e8;
  KVar1 = CentroidLocation->m_f64Y;
  (this->m_CentLocation).m_f64X = CentroidLocation->m_f64X;
  (this->m_CentLocation).m_f64Y = KVar1;
  (this->m_CentLocation).m_f64Z = CentroidLocation->m_f64Z;
  this->m_f32Rad = Radius;
  this->m_ui32Padding = 0;
  (this->super_EnvironmentRecord).m_ui8Index = Index;
  (this->super_EnvironmentRecord).m_ui32EnvRecTyp = 0x10000;
  (this->super_EnvironmentRecord).m_ui16Length = 0x100;
  return;
}

Assistant:

BoundingSphereRecord::BoundingSphereRecord( KUINT8 Index, const WorldCoordinates & CentroidLocation, KFLOAT32 Radius ) :
    m_CentLocation( CentroidLocation ),
    m_f32Rad( Radius ),
    m_ui32Padding( 0 )
{
    m_ui8Index = Index;
    m_ui32EnvRecTyp = BoundingSphereRecordType;
    m_ui16Length = ( BOUNDING_SPHERE_RECORD_SIZE - ENVIRONMENT_RECORD_SIZE ) * 8;
}